

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
pstore::dump::string::write_unquoted<std::ostream>
          (basic_ostream<char,_std::char_traits<char>_> *os,string *v)

{
  char cVar1;
  size_type sVar2;
  size_type sVar3;
  char *pcVar4;
  
  pcVar4 = (v->_M_dataplus)._M_p;
  sVar2 = v->_M_string_length;
  if (sVar2 == 0) {
    sVar2 = 0;
  }
  else if ((byte)(*pcVar4 - 0x21U) < 2) {
    std::operator<<(os,"\\");
    pcVar4 = (v->_M_dataplus)._M_p;
    sVar2 = v->_M_string_length;
  }
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    cVar1 = pcVar4[sVar3];
    if (cVar1 == '\\') {
      std::operator<<(os,'\\');
    }
    std::operator<<(os,cVar1);
  }
  return os;
}

Assistant:

OStream & string::write_unquoted (OStream & os, std::string const & v) {
            // If the string starts with backslash or bang, prefix with a backslash
            if (v.length () > 0) {
                auto const front = v.front ();
                if (front == '\"' || front == '!') {
                    os << "\\";
                }
            }
            // Emit the characters; a backslash is escaped.
            for (char ch : v) {
                if (ch == '\\') {
                    os << '\\';
                }
                os << ch;
            }
            return os;
        }